

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,int value,string *url)

{
  int iVar1;
  undefined *puVar2;
  ostream *poVar3;
  A *pAVar4;
  size_t sVar5;
  ostream *stream;
  stringstream href;
  A a;
  TD td;
  CENTER center;
  TR tr;
  string local_8d8;
  long *local_8b8;
  long local_8b0;
  long local_8a8 [2];
  stringstream local_898 [16];
  ostream local_888 [112];
  ios_base local_818 [264];
  TAG local_710;
  undefined1 local_558 [432];
  ostream *local_3a8;
  TAG local_3a0;
  TAG local_1e8;
  
  stream = (ostream *)(s + 0x10);
  HTML::TR::TR((TR *)&local_1e8,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_1e8.m_stream,">",1);
  HTML::TD::TD((TD *)local_558,stream);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_558 + 0x38),(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  std::ostream::operator<<((ostream *)(local_558 + 0x38),value);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
  HTML::CENTER::CENTER((CENTER *)&local_3a0,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
  std::__cxx11::stringstream::stringstream(local_898);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_888,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"&",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
  std::ostream::operator<<((ostream *)poVar3,value + -10);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pAVar4 = HTML::A::href((A *)&local_710,&local_8d8);
  local_8b8 = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"<<","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar4->super_TAG).field_0x38,(char *)local_8b8,local_8b0);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar4->super_TAG).m_stream,">",1);
  if (local_8b8 != local_8a8) {
    operator_delete(local_8b8,local_8a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  std::ios_base::~ios_base(local_818);
  puVar2 = HTML::NBSP;
  iVar1 = (int)stream;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar5);
  }
  std::__cxx11::stringstream::stringstream(local_898);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_888,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"&",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
  std::ostream::operator<<((ostream *)poVar3,value + -1);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pAVar4 = HTML::A::href((A *)&local_710,&local_8d8);
  local_8b8 = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"<","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar4->super_TAG).field_0x38,(char *)local_8b8,local_8b0);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar4->super_TAG).m_stream,">",1);
  if (local_8b8 != local_8a8) {
    operator_delete(local_8b8,local_8a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  std::ios_base::~ios_base(local_818);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"|",1);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar5);
  }
  std::__cxx11::stringstream::stringstream(local_898);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_888,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"&",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
  std::ostream::operator<<((ostream *)poVar3,value + 1);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pAVar4 = HTML::A::href((A *)&local_710,&local_8d8);
  local_8b8 = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,">","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar4->super_TAG).field_0x38,(char *)local_8b8,local_8b0);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar4->super_TAG).m_stream,">",1);
  if (local_8b8 != local_8a8) {
    operator_delete(local_8b8,local_8a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  std::ios_base::~ios_base(local_818);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar5);
  }
  std::__cxx11::stringstream::stringstream(local_898);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_888,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"&",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
  std::ostream::operator<<((ostream *)poVar3,value + 10);
  HTML::A::A((A *)&local_710,stream);
  std::__cxx11::stringbuf::str();
  pAVar4 = HTML::A::href((A *)&local_710,&local_8d8);
  local_8b8 = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,">>","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar4->super_TAG).field_0x38,(char *)local_8b8,local_8b0);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar4->super_TAG).m_stream,">",1);
  if (local_8b8 != local_8a8) {
    operator_delete(local_8b8,local_8a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG(&local_710);
  std::__cxx11::stringstream::~stringstream(local_898);
  std::ios_base::~ios_base(local_818);
  HTML::TAG::~TAG(&local_3a0);
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TAG::~TAG(&local_1e8);
  return;
}

Assistant:

void HttpConnection::showRow
( std::stringstream& s, const std::string& name, int value, const std::string& url )
{
    { TR tr(s); tr.text();
      { TD td(s); td.text(name); }
      { TD td(s); td.text(value); }
      { TD td(s); td.text();
        CENTER center(s); center.text();
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value - 10;
          A a(s); a.href(href.str()).text("<<");
        }
        s << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value - 1;
          A a(s); a.href(href.str()).text("<");
        }
        s << NBSP << "|" << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value + 1;
          A a(s); a.href(href.str()).text(">");
        }
        s << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value + 10;
          A a(s); a.href(href.str()).text(">>");
        }
      }
    }
}